

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O0

void __thiscall TxRequestTracker::Impl::Impl(Impl *this,bool deterministic)

{
  ByPeerViewExtractor *al;
  ByPeerViewExtractor *in_RDI;
  ByPeerViewExtractor *t1;
  long in_FS_OFFSET;
  allocator<(anonymous_namespace)::Announcement> *in_stack_ffffffffffffff38;
  tuple<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  *t0;
  undefined8 in_stack_ffffffffffffff60;
  PriorityComputer *in_stack_ffffffffffffff68;
  ctor_args_list *args_list;
  multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
  *this_00;
  undefined1 local_54 [44];
  ctor_args_list local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)in_RDI = 0;
  t1 = in_RDI + 8;
  anon_unknown.dwarf_237ecec::PriorityComputer::PriorityComputer
            (in_stack_ffffffffffffff68,SUB81((ulong)in_stack_ffffffffffffff60 >> 0x38,0));
  al = in_RDI + 0x18;
  boost::tuples::
  make_tuple<(anonymous_namespace)::ByPeerViewExtractor,std::less<std::tuple<long,bool,uint256_const&>>>
            (in_RDI,(less<std::tuple<long,_bool,_const_uint256_&>_> *)in_stack_ffffffffffffff38);
  t0 = (tuple<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
        *)(local_54 + 4);
  anon_unknown.dwarf_237ecec::ByTxHashViewExtractor::ByTxHashViewExtractor
            ((ByTxHashViewExtractor *)in_stack_ffffffffffffff38,(PriorityComputer *)0x1485b05);
  boost::tuples::
  make_tuple<(anonymous_namespace)::ByTxHashViewExtractor,std::less<std::tuple<uint256_const&,(anonymous_namespace)::State,unsigned_long>>>
            ((ByTxHashViewExtractor *)in_RDI,
             (less<std::tuple<const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>_> *)
             in_stack_ffffffffffffff38);
  boost::tuples::
  make_tuple<(anonymous_namespace)::ByTimeViewExtractor,std::less<std::pair<(anonymous_namespace)::WaitState,std::chrono::duration<long,std::ratio<1l,1000000l>>>>>
            ((ByTimeViewExtractor *)in_RDI,
             (less<std::pair<(anonymous_namespace)::WaitState,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>
              *)in_stack_ffffffffffffff38);
  args_list = &local_28;
  boost::tuples::
  make_tuple<boost::tuples::tuple<(anonymous_namespace)::ByPeerViewExtractor,std::less<std::tuple<long,bool,uint256_const&>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>,boost::tuples::tuple<(anonymous_namespace)::ByTxHashViewExtractor,std::less<std::tuple<uint256_const&,(anonymous_namespace)::State,unsigned_long>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>,boost::tuples::tuple<(anonymous_namespace)::ByTimeViewExtractor,std::less<std::pair<(anonymous_namespace)::WaitState,std::chrono::duration<long,std::ratio<1l,1000000l>>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
            (t0,(tuple<(anonymous_namespace)::ByTxHashViewExtractor,_std::less<std::tuple<const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
                 *)t1,(tuple<(anonymous_namespace)::ByTimeViewExtractor,_std::less<std::pair<(anonymous_namespace)::WaitState,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
                       *)in_RDI);
  this_00 = (multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
             *)local_54;
  std::allocator<(anonymous_namespace)::Announcement>::allocator(in_stack_ffffffffffffff38);
  boost::multi_index::
  multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
  ::multi_index_container(this_00,args_list,(allocator_type *)al);
  std::allocator<(anonymous_namespace)::Announcement>::~allocator(in_stack_ffffffffffffff38);
  std::
  unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
  ::unordered_map((unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
                   *)in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit Impl(bool deterministic) :
        m_computer(deterministic),
        // Explicitly initialize m_index as we need to pass a reference to m_computer to ByTxHashViewExtractor.
        m_index(boost::make_tuple(
            boost::make_tuple(ByPeerViewExtractor(), std::less<ByPeerView>()),
            boost::make_tuple(ByTxHashViewExtractor(m_computer), std::less<ByTxHashView>()),
            boost::make_tuple(ByTimeViewExtractor(), std::less<ByTimeView>())
        )) {}